

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::PartialBlock::AddUninitializedRegion(PartialBlock *this,idx_t start,idx_t end)

{
  UninitializedRegion local_10;
  
  local_10.start = start;
  local_10.end = end;
  ::std::vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>::
  emplace_back<duckdb::UninitializedRegion>
            (&(this->uninitialized_regions).
              super_vector<duckdb::UninitializedRegion,_std::allocator<duckdb::UninitializedRegion>_>
             ,&local_10);
  return;
}

Assistant:

void PartialBlock::AddUninitializedRegion(idx_t start, idx_t end) {
	uninitialized_regions.push_back({start, end});
}